

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode override_login(Curl_easy *data,connectdata *conn)

{
  int iVar1;
  CURLUcode CVar2;
  CURLcode CVar3;
  char **passwordp;
  char **ppcVar4;
  char *pcVar5;
  bool bVar6;
  char *local_68;
  CURLcode result_1;
  CURLcode result;
  _Bool url_provided;
  int ret;
  char **optionsp;
  char **passwdp;
  char **userp;
  CURLUcode uc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  passwdp = &conn->user;
  passwordp = &conn->passwd;
  ppcVar4 = &conn->options;
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*ppcVar4);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *ppcVar4 = pcVar5;
    if (*ppcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((data->set).use_netrc == '\x02') {
    (*Curl_cfree)(*passwdp);
    *passwdp = (char *)0x0;
    (*Curl_cfree)(*passwordp);
    *passwordp = (char *)0x0;
  }
  conn->bits = (ConnectBits)((uint)conn->bits & 0xffdfffff);
  if (((data->set).use_netrc != '\0') && ((data->set).str[0x2a] == (char *)0x0)) {
    bVar6 = (data->state).aptr.user != (char *)0x0;
    if (bVar6) {
      passwdp = &(data->state).aptr.user;
    }
    iVar1 = Curl_parsenetrc((conn->host).name,passwdp,passwordp,(data->set).str[0x14]);
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        Curl_failf(data,".netrc parser error");
        return CURLE_READ_ERROR;
      }
      conn->bits = (ConnectBits)((uint)conn->bits & 0xffdfffff | 0x200000);
    }
    else if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
    {
      if ((data->set).str[0x14] == (char *)0x0) {
        local_68 = ".netrc";
      }
      else {
        local_68 = (data->set).str[0x14];
      }
      Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",(conn->host).name,
                 local_68);
    }
    if (bVar6) {
      (*Curl_cfree)(conn->user);
      conn->user = (char *)0x0;
      pcVar5 = (*Curl_cstrdup)(*passwdp);
      conn->user = pcVar5;
      if (conn->user == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((*passwdp == (char *)0x0) && (*passwordp != (char *)0x0)) {
      pcVar5 = (*Curl_cstrdup)("");
      *passwdp = pcVar5;
      if (*passwdp == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  if (((*passwdp == (char *)0x0) || ((data->state).aptr.user == *passwdp)) ||
     (data_local._4_4_ = Curl_setstropt(&(data->state).aptr.user,*passwdp),
     data_local._4_4_ == CURLE_OK)) {
    if ((data->state).aptr.user != (char *)0x0) {
      CVar2 = curl_url_set((data->state).uh,CURLUPART_USER,(data->state).aptr.user,0x80);
      if (CVar2 != CURLUE_OK) {
        CVar3 = Curl_uc_to_curlcode(CVar2);
        return CVar3;
      }
      if (*passwdp == (char *)0x0) {
        pcVar5 = (*Curl_cstrdup)((data->state).aptr.user);
        *passwdp = pcVar5;
        if (*passwdp == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
    }
    if ((*passwordp == (char *)0x0) ||
       (data_local._4_4_ = Curl_setstropt(&(data->state).aptr.passwd,*passwordp),
       data_local._4_4_ == CURLE_OK)) {
      if ((data->state).aptr.passwd != (char *)0x0) {
        CVar2 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,(data->state).aptr.passwd,0x80);
        if (CVar2 != CURLUE_OK) {
          CVar3 = Curl_uc_to_curlcode(CVar2);
          return CVar3;
        }
        if (*passwordp == (char *)0x0) {
          pcVar5 = (*Curl_cstrdup)((data->state).aptr.passwd);
          *passwordp = pcVar5;
          if (*passwordp == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLUcode uc;
  char **userp = &conn->user;
  char **passwdp = &conn->passwd;
  char **optionsp = &conn->options;

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

#ifndef CURL_DISABLE_NETRC
  if(data->set.use_netrc == CURL_NETRC_REQUIRED) {
    Curl_safefree(*userp);
    Curl_safefree(*passwdp);
  }
  conn->bits.netrc = FALSE;
  if(data->set.use_netrc && !data->set.str[STRING_USERNAME]) {
    int ret;
    bool url_provided = FALSE;

    if(data->state.aptr.user) {
      /* there was a user name in the URL. Use the URL decoded version */
      userp = &data->state.aptr.user;
      url_provided = TRUE;
    }

    ret = Curl_parsenetrc(conn->host.name,
                          userp, passwdp,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the %s file; using defaults",
            conn->host.name,
            (data->set.str[STRING_NETRC_FILE] ?
             data->set.str[STRING_NETRC_FILE] : ".netrc"));
    }
    else if(ret < 0) {
      failf(data, ".netrc parser error");
      return CURLE_READ_ERROR;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
    }
    if(url_provided) {
      Curl_safefree(conn->user);
      conn->user = strdup(*userp);
      if(!conn->user)
        return CURLE_OUT_OF_MEMORY;
    }
    /* no user was set but a password, set a blank user */
    if(!*userp && *passwdp) {
      *userp = strdup("");
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  /* for updated strings, we update them in the URL */
  if(*userp) {
    CURLcode result;
    if(data->state.aptr.user != *userp) {
      /* nothing to do then */
      result = Curl_setstropt(&data->state.aptr.user, *userp);
      if(result)
        return result;
    }
  }
  if(data->state.aptr.user) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, data->state.aptr.user,
                      CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*userp) {
      *userp = strdup(data->state.aptr.user);
      if(!*userp)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  if(*passwdp) {
    CURLcode result = Curl_setstropt(&data->state.aptr.passwd, *passwdp);
    if(result)
      return result;
  }
  if(data->state.aptr.passwd) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD,
                      data->state.aptr.passwd, CURLU_URLENCODE);
    if(uc)
      return Curl_uc_to_curlcode(uc);
    if(!*passwdp) {
      *passwdp = strdup(data->state.aptr.passwd);
      if(!*passwdp)
        return CURLE_OUT_OF_MEMORY;
    }
  }

  return CURLE_OK;
}